

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.hpp
# Opt level: O1

void __thiscall
boost::numeric::ublas::
sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
::set(sparse_matrix_element<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
      *this,value_type *s)

{
  _Rb_tree_header *p_Var1;
  container_type *pcVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_double>_>,_bool> pVar5;
  pair<const_unsigned_long,_double> local_18;
  
  pcVar2 = (this->
           super_container_reference<boost::numeric::ublas::mapped_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
           ).c_;
  local_18.first = pcVar2->size2_ * this->i_ + this->j_;
  p_Var1 = &(pcVar2->data_).
            super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = *(_Base_ptr *)
            ((long)&(pcVar2->data_).
                    super_map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0;
      p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < local_18.first]) {
    if (*(ulong *)(p_Var4 + 1) >= local_18.first) {
      p_Var3 = p_Var4;
    }
  }
  p_Var4 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
     (p_Var4 = p_Var3, local_18.first < *(ulong *)(p_Var3 + 1))) {
    p_Var4 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    local_18.second = *s;
    pVar5 = std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,double>,std::_Select1st<std::pair<unsigned_long_const,double>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,double>>>
            ::_M_insert_unique<std::pair<unsigned_long_const,double>>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,double>,std::_Select1st<std::pair<unsigned_long_const,double>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,double>>>
                        *)&pcVar2->data_,&local_18);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pVar5.first._M_node._M_node[1]._M_parent = (_Base_ptr)*s;
    }
  }
  else {
    p_Var4[1]._M_parent = (_Base_ptr)*s;
  }
  return;
}

Assistant:

void set (const value_type &s) const {
            pointer p = (*this) ().find_element (i_, j_);
            if (!p)
                (*this) ().insert_element (i_, j_, s);
            else
                *p = s;
        }